

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

void xmlRelaxNGNormExtSpace(xmlChar *value)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  xmlChar *start;
  
  if (value == (xmlChar *)0x0) {
    return;
  }
  lVar3 = 0;
  while (((ulong)value[lVar3] < 0x21 && ((0x100002600U >> ((ulong)value[lVar3] & 0x3f) & 1) != 0)))
  {
    lVar3 = lVar3 + 1;
  }
  pbVar1 = value + lVar3;
  if (lVar3 != 0) {
    do {
      bVar2 = *pbVar1;
      uVar4 = (ulong)bVar2;
      if (uVar4 < 0x21) {
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
LAB_00184743:
          bVar2 = (byte)uVar4;
          if (uVar4 == 0) {
LAB_0018478b:
            *value = 0;
            return;
          }
        }
        else {
          while( true ) {
            bVar2 = *pbVar1;
            uVar4 = (ulong)bVar2;
            if (0x20 < uVar4) break;
            if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_00184743;
            pbVar1 = pbVar1 + 1;
          }
        }
      }
      pbVar1 = pbVar1 + 1;
      *value = bVar2;
      value = value + 1;
    } while( true );
  }
LAB_0018475d:
  do {
    value = pbVar1;
    uVar4 = (ulong)*value;
    if (0x20 < uVar4) {
LAB_00184757:
      pbVar1 = value + 1;
      goto LAB_0018475d;
    }
    pbVar1 = value;
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0) {
        return;
      }
      goto LAB_00184757;
    }
    for (; uVar4 = (ulong)*pbVar1, uVar4 < 0x21; pbVar1 = pbVar1 + 1) {
      if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
        if (uVar4 == 0) goto LAB_0018478b;
        break;
      }
    }
  } while( true );
}

Assistant:

static void
xmlRelaxNGNormExtSpace(xmlChar * value)
{
    xmlChar *start = value;
    xmlChar *cur = value;

    if (value == NULL)
        return;

    while (IS_BLANK_CH(*cur))
        cur++;
    if (cur == start) {
        do {
            while ((*cur != 0) && (!IS_BLANK_CH(*cur)))
                cur++;
            if (*cur == 0)
                return;
            start = cur;
            while (IS_BLANK_CH(*cur))
                cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
        } while (1);
    } else {
        do {
            while ((*cur != 0) && (!IS_BLANK_CH(*cur)))
                *start++ = *cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
            /* don't try to normalize the inner spaces */
            while (IS_BLANK_CH(*cur))
                cur++;
            if (*cur == 0) {
                *start = 0;
                return;
            }
            *start++ = *cur++;
        } while (1);
    }
}